

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shortcut.cxx
# Opt level: O0

int Fl_Widget::test_shortcut(char *t,bool require_alt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *p;
  char *pcVar4;
  uint ls;
  uint c;
  bool require_alt_local;
  char *t_local;
  
  if (t == (char *)0x0) {
    t_local._4_4_ = 0;
  }
  else {
    if ((require_alt) && (iVar1 = Fl::event_state(0x80000), iVar1 == 0)) {
      return 0;
    }
    p = Fl::event_text();
    pcVar4 = Fl::event_text();
    iVar1 = Fl::event_length();
    uVar2 = fl_utf8decode(p,pcVar4 + iVar1,(wchar_t *)0x0);
    if (uVar2 == 0) {
      t_local._4_4_ = 0;
    }
    else {
      uVar3 = label_shortcut(t);
      if (uVar2 == uVar3) {
        t_local._4_4_ = 1;
      }
      else {
        t_local._4_4_ = 0;
      }
    }
  }
  return t_local._4_4_;
}

Assistant:

int Fl_Widget::test_shortcut(const char *t, const bool require_alt) {
  if (!t) return 0;
  // for menubars etc. shortcuts must work only if the Alt modifier is pressed
  if (require_alt && Fl::event_state(FL_ALT)==0) return 0;
  unsigned int c = fl_utf8decode(Fl::event_text(), Fl::event_text()+Fl::event_length(), 0);
#ifdef __APPLE__
  // this line makes underline shortcuts work the same way they do on MSWindow
  // and Linux. 
  if (c && Fl::event_state(FL_ALT)) 
    c = Fl::event_key();
#endif
  if (!c) return 0;
  unsigned int ls = label_shortcut(t);
  if (c == ls)
    return 1;
#ifdef __APPLE__
  // On OS X, we need to simulate the upper case keystroke as well
  if (Fl::event_state(FL_ALT) && c<128 && isalpha(c) && (unsigned)toupper(c)==ls)
    return 1;
#endif
  return 0;
}